

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rayfork.c
# Opt level: O0

rf_image *
rf_image_crop_to_buffer
          (rf_image *__return_storage_ptr__,rf_image image,rf_rec crop,void *dst,rf_int dst_size,
          rf_uncompressed_pixel_format dst_format)

{
  long lVar1;
  rf_source_location source_location;
  rf_image image_00;
  int iVar2;
  rf_pixel_format format;
  void *pvVar3;
  uint uVar4;
  int iVar5;
  long *in_FS_OFFSET;
  rf_image *prVar6;
  undefined4 uStack_10c;
  undefined4 uStack_d4;
  undefined4 uStack_9c;
  int dst_pixel;
  int src_pixel;
  int src_y;
  int src_x;
  rf_int x;
  rf_int y;
  int crop_w;
  int crop_x;
  int crop_h;
  int crop_y;
  int dst_bpp;
  int src_bpp;
  uchar *dst_ptr;
  uchar *src_ptr;
  int src_size;
  rf_pixel_format src_format;
  int expected_size;
  rf_uncompressed_pixel_format dst_format_local;
  rf_int dst_size_local;
  void *dst_local;
  rf_rec crop_local;
  
  crop_local._0_8_ = crop._8_8_;
  prVar6 = __return_storage_ptr__;
  memset(__return_storage_ptr__,0,0x18);
  if (((undefined1  [24])image & (undefined1  [24])0x100000000) == (undefined1  [24])0x0) {
    rf_log_impl(8,0x1b291e,(char *)0x1);
    lVar1 = *in_FS_OFFSET;
    *(char **)(lVar1 + -0x460) =
         "/workspace/llm4binary/github/license_c_cmakelists/SasLuca[P]rayfork-sokol-template/libs/rayfork/rayfork.c"
    ;
    *(char **)(lVar1 + -0x458) = "rf_image_crop_to_buffer";
    *(undefined8 *)(lVar1 + -0x450) = 0x3dbf;
    *(ulong *)(lVar1 + -0x448) = CONCAT44(uStack_10c,1);
  }
  else {
    dst_local._0_4_ = crop.x;
    pvVar3 = crop._0_8_;
    if (dst_local._0_4_ < 0.0) {
      crop_local.x = crop.width;
      crop_local.y = crop.height;
      crop_local.x = dst_local._0_4_ + crop_local.x;
      dst_local = (void *)((ulong)crop._0_8_ & 0xffffffff00000000);
      pvVar3 = dst_local;
    }
    dst_local = pvVar3;
    if (dst_local._4_4_ < 0.0) {
      crop_local.y = dst_local._4_4_ + crop_local.y;
      dst_local = (void *)((ulong)dst_local & 0xffffffff);
    }
    iVar2 = image.width;
    if ((float)image.width < dst_local._0_4_ + crop_local.x) {
      crop_local.x = (float)image.width - dst_local._0_4_;
    }
    if ((float)image.height < dst_local._4_4_ + crop_local.y) {
      crop_local.y = (float)image.height - dst_local._4_4_;
    }
    if (((float)image.width <= dst_local._0_4_) || ((float)image.height <= dst_local._4_4_)) {
      rf_log_impl(8,0x1b28e6,(char *)0x1);
      lVar1 = *in_FS_OFFSET;
      *(char **)(lVar1 + -0x460) =
           "/workspace/llm4binary/github/license_c_cmakelists/SasLuca[P]rayfork-sokol-template/libs/rayfork/rayfork.c"
      ;
      *(char **)(lVar1 + -0x458) = "rf_image_crop_to_buffer";
      *(undefined8 *)(lVar1 + -0x450) = 0x3dbd;
      *(ulong *)(lVar1 + -0x448) = CONCAT44(uStack_d4,1);
    }
    else {
      uVar4 = rf_pixel_buffer_size((int)crop_local.x,(int)crop_local.y,dst_format);
      if (dst_size < (int)uVar4) {
        source_location.proc_name = "rf_image_crop_to_buffer";
        source_location.file_name =
             "/workspace/llm4binary/github/license_c_cmakelists/SasLuca[P]rayfork-sokol-template/libs/rayfork/rayfork.c"
        ;
        source_location.line_in_file = 0x3dbb;
        rf_log_impl(source_location,RF_LOG_TYPE_ERROR,
                    "Destination buffer is too small. Expected at least %d bytes but was %d",1,
                    (ulong)uVar4,dst_size,"rf_image_crop_to_buffer");
        lVar1 = *in_FS_OFFSET;
        *(char **)(lVar1 + -0x460) =
             "/workspace/llm4binary/github/license_c_cmakelists/SasLuca[P]rayfork-sokol-template/libs/rayfork/rayfork.c"
        ;
        *(char **)(lVar1 + -0x458) = "rf_image_crop_to_buffer";
        *(undefined8 *)(lVar1 + -0x450) = 0x3dbb;
        *(ulong *)(lVar1 + -0x448) = CONCAT44(uStack_9c,1);
      }
      else {
        format = image.format;
        image_00._16_8_ = prVar6;
        image_00._0_16_ = image._8_16_;
        rf_image_size(image_00);
        iVar5 = rf_bytes_per_pixel(format);
        rf_bytes_per_pixel(dst_format);
        for (x = 0; x < (int)crop_local.y; x = x + 1) {
          for (_src_y = 0; _src_y < (int)crop_local.x; _src_y = _src_y + 1) {
            rf_format_one_pixel((void *)((long)image.data +
                                        (long)((((int)x + (int)dst_local._4_4_) * iVar2 +
                                               (int)_src_y + (int)dst_local._0_4_) * iVar5)),format,
                                (void *)((long)dst +
                                        (long)(((int)x * (int)crop_local.x + (int)_src_y) * iVar5)),
                                dst_format);
          }
        }
        prVar6->data = dst;
        prVar6->format = dst_format;
        prVar6->width = (int)crop_local.x;
        prVar6->height = (int)crop_local.y;
        prVar6->valid = true;
      }
    }
  }
  return __return_storage_ptr__;
}

Assistant:

RF_API rf_image rf_image_crop_to_buffer(rf_image image, rf_rec crop, void* dst, rf_int dst_size, rf_uncompressed_pixel_format dst_format)
{
    rf_image result = {0};

    if (image.valid)
    {
        // Security checks to validate crop rectangle
        if (crop.x < 0) { crop.width += crop.x; crop.x = 0; }
        if (crop.y < 0) { crop.height += crop.y; crop.y = 0; }
        if ((crop.x + crop.width) > image.width) { crop.width = image.width - crop.x; }
        if ((crop.y + crop.height) > image.height) { crop.height = image.height - crop.y; }

        if ((crop.x < image.width) && (crop.y < image.height))
        {
            int expected_size = rf_pixel_buffer_size(crop.width, crop.height, dst_format);
            if (dst_size >= expected_size)
            {
                rf_pixel_format src_format = image.format;
                int src_size = rf_image_size(image);

                unsigned char* src_ptr = image.data;
                unsigned char* dst_ptr = dst;

                int src_bpp = rf_bytes_per_pixel(image.format);
                int dst_bpp = rf_bytes_per_pixel(dst_format);

                int crop_y = crop.y;
                int crop_h = crop.height;
                int crop_x = crop.x;
                int crop_w = crop.width;

                for (rf_int y = 0; y < crop_h; y++)
                {
                    for (rf_int x = 0; x < crop_w; x++)
                    {
                        int src_x = x + crop_x;
                        int src_y = y + crop_y;

                        int src_pixel = (src_y * image.width + src_x) * src_bpp;
                        int dst_pixel = (y * crop_w + x) * src_bpp;
                        RF_ASSERT(src_pixel < src_size);
                        RF_ASSERT(dst_pixel < dst_size);

                        rf_format_one_pixel(&src_ptr[src_pixel], src_format, &dst_ptr[dst_pixel], dst_format);
                    }
                }

                result.data   = dst;
                result.format = dst_format;
                result.width  = crop.width;
                result.height = crop.height;
                result.valid  = true;
            }
            else RF_LOG_ERROR(RF_BAD_ARGUMENT, "Destination buffer is too small. Expected at least %d bytes but was %d", expected_size, dst_size);
        }
        else RF_LOG_ERROR(RF_BAD_ARGUMENT, "Image can not be cropped, crop rectangle out of bounds.");
    }
    else RF_LOG_ERROR(RF_BAD_ARGUMENT, "Image is invalid.");

    return result;
}